

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printLevelRoundingMode(LevelRoundingMode lm)

{
  ostream *this;
  int in_EDI;
  
  if (in_EDI == 0) {
    std::operator<<((ostream *)&std::cout,"down");
  }
  else if (in_EDI == 1) {
    std::operator<<((ostream *)&std::cout,"up");
  }
  else {
    this = std::operator<<((ostream *)&std::cout,"mode ");
    std::ostream::operator<<(this,in_EDI);
  }
  return;
}

Assistant:

void
printLevelRoundingMode (LevelRoundingMode lm)
{
    switch (lm)
    {
        case ROUND_DOWN: cout << "down"; break;

        case ROUND_UP: cout << "up"; break;

        default: cout << "mode " << int (lm); break;
    }
}